

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall
QListWidgetPrivate::emitItemDoubleClicked(QListWidgetPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  lVar2 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  if ((ulong)(long)index->r < *(ulong *)(lVar2 + 0x20)) {
    local_30 = *(undefined8 *)(*(long *)(lVar2 + 0x18) + (long)index->r * 8);
  }
  else {
    local_30 = 0;
  }
  puStack_20 = &local_30;
  local_28 = (void *)0x0;
  QMetaObject::activate(pQVar1,&QListWidget::staticMetaObject,2,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::emitItemDoubleClicked(const QModelIndex &index)
{
    Q_Q(QListWidget);
    emit q->itemDoubleClicked(listModel()->at(index.row()));
}